

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O1

CSVReaderOptions * __thiscall
duckdb::CSVReaderOptions::operator=(CSVReaderOptions *this,CSVReaderOptions *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CSVOption<char> CVar3;
  CSVOption<char> CVar4;
  CSVOption<duckdb::NewLineIdentifier> CVar5;
  undefined7 uVar6;
  CSVOption<bool> CVar7;
  idx_t iVar8;
  bool bVar9;
  unsigned_long uVar10;
  undefined3 uVar11;
  
  (this->dialect_options).state_machine_options.delimiter.set_by_user =
       (param_1->dialect_options).state_machine_options.delimiter.set_by_user;
  ::std::__cxx11::string::operator=
            ((string *)&(this->dialect_options).state_machine_options.delimiter.value,
             (string *)&(param_1->dialect_options).state_machine_options.delimiter.value);
  CVar3 = (param_1->dialect_options).state_machine_options.escape;
  CVar4 = (param_1->dialect_options).state_machine_options.comment;
  CVar5 = (param_1->dialect_options).state_machine_options.new_line;
  (this->dialect_options).state_machine_options.quote =
       (param_1->dialect_options).state_machine_options.quote;
  (this->dialect_options).state_machine_options.escape = CVar3;
  (this->dialect_options).state_machine_options.comment = CVar4;
  (this->dialect_options).state_machine_options.new_line = CVar5;
  (this->dialect_options).state_machine_options.strict_mode =
       (param_1->dialect_options).state_machine_options.strict_mode;
  (this->dialect_options).num_cols = (param_1->dialect_options).num_cols;
  (this->dialect_options).header = (param_1->dialect_options).header;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::operator=(&(this->dialect_options).date_format,&(param_1->dialect_options).date_format);
  uVar6 = *(undefined7 *)&(param_1->dialect_options).skip_rows.field_0x1;
  uVar10 = (param_1->dialect_options).skip_rows.value;
  (this->dialect_options).skip_rows.set_by_user = (param_1->dialect_options).skip_rows.set_by_user;
  *(undefined7 *)&(this->dialect_options).skip_rows.field_0x1 = uVar6;
  (this->dialect_options).skip_rows.value = uVar10;
  (this->dialect_options).rows_until_header = (param_1->dialect_options).rows_until_header;
  CVar7 = param_1->store_rejects;
  this->ignore_errors = param_1->ignore_errors;
  this->store_rejects = CVar7;
  (this->rejects_table_name).set_by_user = (param_1->rejects_table_name).set_by_user;
  ::std::__cxx11::string::operator=
            ((string *)&(this->rejects_table_name).value,
             (string *)&(param_1->rejects_table_name).value);
  (this->rejects_scan_name).set_by_user = (param_1->rejects_scan_name).set_by_user;
  ::std::__cxx11::string::operator=
            ((string *)&(this->rejects_scan_name).value,
             (string *)&(param_1->rejects_scan_name).value);
  uVar1 = *(undefined4 *)((long)&param_1->rejects_limit + 4);
  iVar8 = param_1->buffer_sample_size;
  uVar2 = *(undefined4 *)((long)&param_1->buffer_sample_size + 4);
  *(int *)&this->rejects_limit = (int)param_1->rejects_limit;
  *(undefined4 *)((long)&this->rejects_limit + 4) = uVar1;
  *(int *)&this->buffer_sample_size = (int)iVar8;
  *(undefined4 *)((long)&this->buffer_sample_size + 4) = uVar2;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->null_str,&param_1->null_str);
  this->comment = param_1->comment;
  bVar9 = param_1->allow_quoted_nulls;
  this->compression = param_1->compression;
  this->allow_quoted_nulls = bVar9;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->sql_types_per_column,&param_1->sql_types_per_column);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &param_1->sql_type_list);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->name_list,&param_1->name_list);
  this->columns_set = param_1->columns_set;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &param_1->auto_type_candidates);
  ::std::__cxx11::string::operator=
            ((string *)&this->sniffer_user_mismatch_error,
             (string *)&param_1->sniffer_user_mismatch_error);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->was_type_manually_set,
             &(param_1->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>);
  uVar11 = *(undefined3 *)&(param_1->maximum_line_size).field_0x1;
  uVar1 = *(undefined4 *)&(param_1->maximum_line_size).field_0x4;
  uVar10 = (param_1->maximum_line_size).value;
  uVar2 = *(undefined4 *)((long)&(param_1->maximum_line_size).value + 4);
  (this->maximum_line_size).set_by_user = (param_1->maximum_line_size).set_by_user;
  *(undefined3 *)&(this->maximum_line_size).field_0x1 = uVar11;
  *(undefined4 *)&(this->maximum_line_size).field_0x4 = uVar1;
  *(int *)&(this->maximum_line_size).value = (int)uVar10;
  *(undefined4 *)((long)&(this->maximum_line_size).value + 4) = uVar2;
  this->normalize_names = param_1->normalize_names;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&this->force_not_null_names,&param_1->force_not_null_names);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->force_not_null,
             &(param_1->force_not_null).super_vector<bool,_std::allocator<bool>_>);
  this->sample_size_chunks = param_1->sample_size_chunks;
  bVar9 = param_1->auto_detect;
  this->all_varchar = param_1->all_varchar;
  this->auto_detect = bVar9;
  ::std::__cxx11::string::operator=((string *)&this->file_path,(string *)&param_1->file_path);
  uVar6 = *(undefined7 *)&(param_1->buffer_size_option).field_0x1;
  uVar10 = (param_1->buffer_size_option).value;
  (this->buffer_size_option).set_by_user = (param_1->buffer_size_option).set_by_user;
  *(undefined7 *)&(this->buffer_size_option).field_0x1 = uVar6;
  (this->buffer_size_option).value = uVar10;
  ::std::__cxx11::string::operator=
            ((string *)&this->decimal_separator,(string *)&param_1->decimal_separator);
  bVar9 = param_1->parallel;
  this->null_padding = param_1->null_padding;
  this->parallel = bVar9;
  ::std::__cxx11::string::operator=((string *)&this->encoding,(string *)&param_1->encoding);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->user_defined_parameters,&param_1->user_defined_parameters);
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->force_quote,
             &(param_1->force_quote).super_vector<bool,_std::allocator<bool>_>);
  ::std::__cxx11::string::operator=((string *)&this->prefix,(string *)&param_1->prefix);
  ::std::__cxx11::string::operator=((string *)&this->suffix,(string *)&param_1->suffix);
  ::std::__cxx11::string::operator=
            ((string *)&this->write_newline,(string *)&param_1->write_newline);
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::operator=(&this->write_date_format,&param_1->write_date_format);
  ::std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::operator=(&this->has_format,&param_1->has_format);
  this->multi_file_reader = param_1->multi_file_reader;
  return this;
}

Assistant:

CSVReaderOptions() {
	}